

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateRSTests.cpp
# Opt level: O3

int __thiscall
vkt::DynamicState::DynamicStateRSTests::init(DynamicStateRSTests *this,EVP_PKEY_CTX *ctx)

{
  TestContext *pTVar1;
  int extraout_EAX;
  mapped_type *ppcVar2;
  TestNode *pTVar3;
  ShaderMap shaderPaths;
  long *local_130 [2];
  long local_120 [2];
  long *local_110 [2];
  long local_100 [2];
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  local_f0;
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  local_c0;
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  local_90;
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  local_60;
  
  local_f0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_f0._M_impl.super__Rb_tree_header._M_header;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_f0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_130[0] = (long *)((ulong)local_130[0] & 0xffffffff00000000);
  local_f0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_f0._M_impl.super__Rb_tree_header._M_header._M_left;
  ppcVar2 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)&local_f0,(key_type *)local_130);
  *ppcVar2 = "vulkan/dynamic_state/VertexFetch.vert";
  local_130[0] = (long *)CONCAT44(local_130[0]._4_4_,1);
  ppcVar2 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)&local_f0,(key_type *)local_130);
  *ppcVar2 = "vulkan/dynamic_state/VertexFetch.frag";
  pTVar3 = (TestNode *)operator_new(0xa0);
  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  local_130[0] = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"depth_bias","");
  local_110[0] = local_100;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_110,"Test depth bias functionality","");
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::_Rb_tree(&local_60,&local_f0);
  tcu::TestCase::TestCase((TestCase *)pTVar3,pTVar1,(char *)local_130[0],(char *)local_110[0]);
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__InstanceFactory_00d30588;
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
              *)(pTVar3 + 1),&local_60);
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::~_Rb_tree(&local_60);
  if (local_110[0] != local_100) {
    operator_delete(local_110[0],local_100[0] + 1);
  }
  if (local_130[0] != local_120) {
    operator_delete(local_130[0],local_120[0] + 1);
  }
  pTVar3 = (TestNode *)operator_new(0xa0);
  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  local_130[0] = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"depth_bias_clamp","");
  local_110[0] = local_100;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_110,"Test depth bias clamp functionality","");
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::_Rb_tree(&local_90,&local_f0);
  tcu::TestCase::TestCase((TestCase *)pTVar3,pTVar1,(char *)local_130[0],(char *)local_110[0]);
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__InstanceFactory_00d30668;
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
              *)(pTVar3 + 1),&local_90);
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::~_Rb_tree(&local_90);
  if (local_110[0] != local_100) {
    operator_delete(local_110[0],local_100[0] + 1);
  }
  if (local_130[0] != local_120) {
    operator_delete(local_130[0],local_120[0] + 1);
  }
  pTVar3 = (TestNode *)operator_new(0xa0);
  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  local_130[0] = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"line_width","");
  local_110[0] = local_100;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_110,"Draw a line with width set to max defined by physical device","");
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::_Rb_tree(&local_c0,&local_f0);
  tcu::TestCase::TestCase((TestCase *)pTVar3,pTVar1,(char *)local_130[0],(char *)local_110[0]);
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__InstanceFactory_00d30708;
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
              *)(pTVar3 + 1),&local_c0);
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::~_Rb_tree(&local_c0);
  if (local_110[0] != local_100) {
    operator_delete(local_110[0],local_100[0] + 1);
  }
  if (local_130[0] != local_120) {
    operator_delete(local_130[0],local_120[0] + 1);
  }
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::~_Rb_tree(&local_f0);
  return extraout_EAX;
}

Assistant:

void DynamicStateRSTests::init (void)
{
	ShaderMap shaderPaths;
	shaderPaths[glu::SHADERTYPE_VERTEX]		= "vulkan/dynamic_state/VertexFetch.vert";
	shaderPaths[glu::SHADERTYPE_FRAGMENT]	= "vulkan/dynamic_state/VertexFetch.frag";

	addChild(new InstanceFactory<DepthBiasParamTestInstance>(m_testCtx, "depth_bias", "Test depth bias functionality", shaderPaths));
	addChild(new InstanceFactory<DepthBiasClampParamTestInstance>(m_testCtx, "depth_bias_clamp", "Test depth bias clamp functionality", shaderPaths));
	addChild(new InstanceFactory<LineWidthParamTestInstance>(m_testCtx, "line_width", "Draw a line with width set to max defined by physical device", shaderPaths));
}